

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O2

void osMutex::StaticInit(void)

{
  pthread_mutexattr_t attr;
  
  if (StaticInit()::IsInitialized == '\0') {
    StaticInit()::IsInitialized = '\x01';
    pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
    pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    pthread_mutex_init((pthread_mutex_t *)&MutexListMutex,(pthread_mutexattr_t *)&attr);
  }
  return;
}

Assistant:

void osMutex::StaticInit()
{
    static bool IsInitialized = false;
    if (!IsInitialized)
    {
        IsInitialized = true;
#ifdef __linux__
        pthread_mutexattr_t attr;
        pthread_mutexattr_init(&attr);
        pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&MutexListMutex, &attr);
#endif
    }
}